

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O0

Vec_Int_t * Gia_ManFindPivots(Gia_Man_t *p,int SelectShift,int fOnlyCis,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pObj;
  int *piVar7;
  Vec_Int_t *vTemp;
  int t_1;
  int t;
  int Limit;
  int *pPerm;
  int Count;
  int j;
  int i;
  Vec_Int_t *vResult;
  Vec_Int_t *vCount;
  Vec_Int_t *vWeights;
  Vec_Int_t *vPivots;
  int fVerbose_local;
  int fOnlyCis_local;
  int SelectShift_local;
  Gia_Man_t *p_local;
  
  Gia_ManCreateRefs(p);
  piVar7 = p->pRefs;
  iVar1 = Gia_ManObjNum(p);
  pVVar6 = Vec_IntAllocArray(piVar7,iVar1);
  p->pRefs = (int *)0x0;
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntAlloc(100);
  Count = 0;
  do {
    iVar1 = Vec_IntSize(pVVar6);
    if (iVar1 <= Count) {
      Vec_IntFree(pVVar6);
      if (fVerbose != 0) {
        uVar2 = Vec_IntSize(p_01);
        iVar1 = Gia_ManCiNum(p);
        iVar3 = Gia_ManAndNum(p);
        printf("Selected %d pivots with more than one fanout (out of %d CIs and ANDs).\n",
               (ulong)uVar2,(ulong)(uint)(iVar1 + iVar3));
      }
      Gia_ManRandom(1);
      Gia_ManRandom(0);
      for (Count = 0; iVar1 = Vec_IntSize(p_01), Count < iVar1; Count = Count + 1) {
        uVar2 = Gia_ManRandom(0);
        uVar4 = Vec_IntSize(p_01);
        uVar4 = (uVar2 >> 1) % uVar4;
        iVar1 = p_00->pArray[Count];
        p_00->pArray[Count] = p_00->pArray[(int)uVar4];
        p_00->pArray[(int)uVar4] = iVar1;
        iVar1 = p_01->pArray[Count];
        p_01->pArray[Count] = p_01->pArray[(int)uVar4];
        p_01->pArray[(int)uVar4] = iVar1;
      }
      if (SelectShift == 0) {
        piVar7 = Vec_IntArray(p_01);
        iVar1 = Vec_IntSize(p_01);
        _t = Abc_QuickSortCost(piVar7,iVar1,1);
      }
      else {
        iVar1 = Vec_IntSize(p_01);
        pVVar6 = Vec_IntStartNatural(iVar1);
        _t = Vec_IntReleaseArray(pVVar6);
        Vec_IntFree(pVVar6);
      }
      iVar1 = Vec_IntSize(p_01);
      iVar1 = Abc_MinInt(0x40,iVar1);
      pVVar6 = Vec_IntAlloc(iVar1);
      for (Count = 0; Count < iVar1; Count = Count + 1) {
        iVar3 = Vec_IntSize(p_01);
        uVar2 = (Count + SelectShift) % iVar3;
        if (fVerbose != 0) {
          uVar4 = Vec_IntEntry(p_00,_t[(int)uVar2]);
          uVar5 = Vec_IntEntry(p_01,_t[(int)uVar2]);
          printf("%2d : Pivot =%7d  Fanout =%7d\n",(ulong)uVar2,(ulong)uVar4,(ulong)uVar5);
        }
        iVar3 = Vec_IntEntry(p_00,_t[(int)uVar2]);
        Vec_IntPush(pVVar6,iVar3);
      }
      Vec_IntFree(p_00);
      Vec_IntFree(p_01);
      if (_t != (int *)0x0) {
        free(_t);
      }
      return pVVar6;
    }
    iVar1 = Vec_IntEntry(pVVar6,Count);
    if (1 < iVar1) {
      if (fOnlyCis != 0) {
        pObj = Gia_ManObj(p,Count);
        iVar3 = Gia_ObjIsCi(pObj);
        if (iVar3 == 0) goto LAB_00920fd5;
      }
      Vec_IntPush(p_00,Count);
      Vec_IntPush(p_01,iVar1);
    }
LAB_00920fd5:
    Count = Count + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_ManFindPivots( Gia_Man_t * p, int SelectShift, int fOnlyCis, int fVerbose )
{
    Vec_Int_t * vPivots, * vWeights;
    Vec_Int_t * vCount, * vResult;
    int i, j, Count, * pPerm, Limit;
/*
    Gia_Obj_t * pObj;
    // count MUX controls
    vCount = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        Gia_Obj_t * pNodeC, * pNodeT, * pNodeE;
        if ( !Gia_ObjIsMuxType(pObj) ) 
            continue;
        pNodeC = Gia_ObjRecognizeMux( pObj, &pNodeT, &pNodeE );
        Vec_IntAddToEntry( vCount, Gia_ObjId(p, Gia_Regular(pNodeC)), 1 );
    }
*/
    // count references
    Gia_ManCreateRefs( p );
    vCount = Vec_IntAllocArray( p->pRefs, Gia_ManObjNum(p) ); p->pRefs = NULL;

    // collect nodes 
    vPivots  = Vec_IntAlloc( 100 );
    vWeights = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vCount, Count, i )
    {
        if ( Count < 2 ) continue;
        if ( fOnlyCis && !Gia_ObjIsCi(Gia_ManObj(p, i)) )
            continue;
        Vec_IntPush( vPivots, i );
        Vec_IntPush( vWeights, Count );
    }
    Vec_IntFree( vCount );

    if ( fVerbose )
        printf( "Selected %d pivots with more than one fanout (out of %d CIs and ANDs).\n", Vec_IntSize(vWeights), Gia_ManCiNum(p) + Gia_ManAndNum(p) );

    // permute
    Gia_ManRandom(1);
    Gia_ManRandom(0);
    for ( i = 0; i < Vec_IntSize(vWeights); i++ )
    {
        j = (Gia_ManRandom(0) >> 1) % Vec_IntSize(vWeights);
        ABC_SWAP( int, vPivots->pArray[i], vPivots->pArray[j] );
        ABC_SWAP( int, vWeights->pArray[i], vWeights->pArray[j] );
    }
    // sort
    if ( SelectShift == 0 )
        pPerm = Abc_QuickSortCost( Vec_IntArray(vWeights), Vec_IntSize(vWeights), 1 );
    else
    {
        Vec_Int_t * vTemp = Vec_IntStartNatural( Vec_IntSize(vWeights) );
        pPerm = Vec_IntReleaseArray( vTemp );
        Vec_IntFree( vTemp );
    }

    // select    
    Limit = Abc_MinInt( 64, Vec_IntSize(vWeights) );
    vResult = Vec_IntAlloc( Limit );
    for ( i = 0; i < Limit; i++ )
    {
        j = (i + SelectShift) % Vec_IntSize(vWeights);
        if ( fVerbose )
            printf( "%2d : Pivot =%7d  Fanout =%7d\n", j, Vec_IntEntry(vPivots, pPerm[j]), Vec_IntEntry(vWeights, pPerm[j]) );
        Vec_IntPush( vResult, Vec_IntEntry(vPivots, pPerm[j]) );
    }

    Vec_IntFree( vPivots );
    Vec_IntFree( vWeights );
    ABC_FREE( pPerm );

    return vResult;
}